

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

void nullcTerminate(void)

{
  NULLC::nullcLastError = "";
  if ((NULLC::initialized & 1) != 0) {
    NULLC::destruct<CompilerContext>(NULLC::compilerCtx);
    NULLC::compilerCtx = (CompilerContext *)0x0;
    GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U>::Reset
              ((GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U> *)NULLC::allocator);
    (*(code *)NULLC::dealloc)(NULLC::argBuf);
    NULLC::argBuf = 0;
    (*(code *)NULLC::dealloc)(NULLC::errorBuf);
    NULLC::errorBuf = 0;
    (*(code *)NULLC::dealloc)(NULLC::outputBuf);
    NULLC::outputBuf = 0;
    (*(code *)NULLC::dealloc)(NULLC::tempOutputBuf);
    NULLC::tempOutputBuf = 0;
    BinaryCache::Terminate();
    nullcDeinitTypeinfoModule();
    nullcDeinitDynamicModule();
    NULLC::destruct<Linker>(NULLC::linker);
    NULLC::linker = (Linker *)0x0;
    NULLC::destruct<ExecutorX86>(NULLC::executorX86);
    NULLC::executorX86 = (ExecutorX86 *)0x0;
    NULLC::destruct<ExecutorRegVm>(NULLC::executorRegVm);
    NULLC::executorRegVm = (ExecutorRegVm *)0x0;
    NULLC::ResetMemory();
    NULLC::initialized = 0;
  }
  return;
}

Assistant:

void nullcTerminate()
{
	using namespace NULLC;
	nullcLastError = "";
	if(!initialized)
		return;

	NULLC::destruct(compilerCtx);
	compilerCtx = NULL;

	allocator.Reset();

	NULLC::dealloc(argBuf);
	argBuf = NULL;

	NULLC::dealloc(errorBuf);
	errorBuf = NULL;

	NULLC::dealloc(outputBuf);
	outputBuf = NULL;

	NULLC::dealloc(tempOutputBuf);
	tempOutputBuf = NULL;

	BinaryCache::Terminate();

#ifndef NULLC_NO_EXECUTOR
	nullcDeinitTypeinfoModule();
	nullcDeinitDynamicModule();

	NULLC::destruct(linker);
	linker = NULL;
#endif
#ifdef NULLC_BUILD_X86_JIT
	NULLC::destruct(executorX86);
	executorX86 = NULL;
#endif
#ifndef NULLC_NO_EXECUTOR
	NULLC::destruct(executorRegVm);
	executorRegVm = NULL;
#endif

#ifndef NULLC_NO_EXECUTOR
	NULLC::ResetMemory();
#endif

	initialized = false;
}